

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureTestUtil.cpp
# Opt level: O0

void glu::TextureTestUtil::sampleTextureProjected
               (SurfaceAccess *dst,Texture1DView *rawSrc,Vec4 *sq,ReferenceParams *params)

{
  LodMode mode;
  float fVar1;
  float wx_00;
  int iVar2;
  int iVar3;
  long lVar4;
  Texture1DView TVar5;
  float local_188;
  float local_184;
  float local_180;
  float local_17c;
  float local_154;
  Vector<float,_4> local_13c;
  Vector<float,_4> local_12c;
  Vec4 local_11c;
  float local_10c;
  float local_108;
  float lod;
  float s;
  float triNy;
  float triNx;
  float triWy;
  float triWx;
  int triNdx;
  float ny;
  float nx;
  float wy;
  float wx;
  int px;
  int py;
  Vec3 triW [2];
  undefined1 local_b8 [8];
  Vec3 triU [2];
  undefined1 local_98 [8];
  Vec3 triS [2];
  tcu local_78 [8];
  Vec4 uq;
  float dstH;
  float dstW;
  float lodBias;
  undefined1 local_50 [8];
  Texture1DView src;
  vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> srcLevelStorage;
  ReferenceParams *params_local;
  Vec4 *sq_local;
  Texture1DView *rawSrc_local;
  SurfaceAccess *dst_local;
  
  std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>::vector
            ((vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> *)
             &src.m_levels);
  TVar5 = tcu::getEffectiveTextureView
                    (rawSrc,(vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                             *)&src.m_levels,&params->sampler);
  src._0_8_ = TVar5.m_levels;
  local_50._0_4_ = TVar5.m_numLevels;
  if (((params->super_RenderParams).flags & 2) == 0) {
    local_154 = 0.0;
  }
  else {
    local_154 = (params->super_RenderParams).bias;
  }
  iVar2 = tcu::SurfaceAccess::getWidth(dst);
  uq.m_data[3] = (float)iVar2;
  iVar2 = tcu::SurfaceAccess::getHeight(dst);
  uq.m_data[2] = (float)iVar2;
  iVar2 = tcu::Texture1DView::getWidth((Texture1DView *)local_50);
  tcu::operator*(local_78,sq,(float)iVar2);
  tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)local_98,(int)sq,0,1);
  tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)(triS[0].m_data + 1),(int)sq,3,2);
  tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)local_b8,(int)local_78,0,1);
  tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)(triU[0].m_data + 1),(int)local_78,3,2);
  tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)&px,(int)params + 0xc,0,1);
  tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)(triW[0].m_data + 1),(int)params + 0xc,3,2);
  for (wx = 0.0; fVar1 = wx, iVar2 = tcu::SurfaceAccess::getHeight(dst), (int)fVar1 < iVar2;
      wx = (float)((int)wx + 1)) {
    for (wy = 0.0; fVar1 = wy, iVar2 = tcu::SurfaceAccess::getWidth(dst), (int)fVar1 < iVar2;
        wy = (float)((int)wy + 1)) {
      nx = (float)(int)wy + 0.5;
      ny = (float)(int)wx + 0.5;
      triNdx = (int)(nx / uq.m_data[3]);
      triWx = ny / uq.m_data[2];
      triWy = (float)(uint)(1.0 <= (float)triNdx + triWx);
      local_17c = nx;
      if (triWy != 0.0) {
        local_17c = uq.m_data[3] - nx;
      }
      triNx = local_17c;
      local_180 = ny;
      if (triWy != 0.0) {
        local_180 = uq.m_data[2] - ny;
      }
      triNy = local_180;
      local_184 = (float)triNdx;
      if (triWy != 0.0) {
        local_184 = 1.0 - (float)triNdx;
      }
      s = local_184;
      local_188 = triWx;
      if (triWy != 0.0) {
        local_188 = 1.0 - triWx;
      }
      lod = local_188;
      local_108 = projectedTriInterpolate
                            ((Vec3 *)(triS[(long)(int)triWy + -1].m_data + 1),
                             (Vec3 *)(&px + (long)(int)triWy * 3),local_184,local_188);
      wx_00 = triNx;
      fVar1 = triNy;
      mode = params->lodMode;
      lVar4 = (long)(int)triWy;
      iVar2 = tcu::SurfaceAccess::getWidth(dst);
      iVar3 = tcu::SurfaceAccess::getHeight(dst);
      local_10c = computeProjectedTriLod
                            (mode,(Vec3 *)(triU[lVar4 + -1].m_data + 1),(Vec3 *)(&px + lVar4 * 3),
                             wx_00,fVar1,(float)iVar2,(float)iVar3);
      local_10c = local_10c + local_154;
      execSample((TextureTestUtil *)&local_13c,(Texture1DView *)local_50,params,local_108,local_10c)
      ;
      tcu::operator*((tcu *)&local_12c,&local_13c,&(params->super_RenderParams).colorScale);
      tcu::operator+((tcu *)&local_11c,&local_12c,&(params->super_RenderParams).colorBias);
      tcu::SurfaceAccess::setPixel(dst,&local_11c,(int)wy,(int)wx);
    }
  }
  std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>::~vector
            ((vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> *)
             &src.m_levels);
  return;
}

Assistant:

static void sampleTextureProjected (const tcu::SurfaceAccess& dst, const tcu::Texture1DView& rawSrc, const tcu::Vec4& sq, const ReferenceParams& params)
{
	// Separate combined DS formats
	std::vector<tcu::ConstPixelBufferAccess>	srcLevelStorage;
	const tcu::Texture1DView					src					= getEffectiveTextureView(rawSrc, srcLevelStorage, params.sampler);

	float										lodBias				= (params.flags & ReferenceParams::USE_BIAS) ? params.bias : 0.0f;
	float										dstW				= (float)dst.getWidth();
	float										dstH				= (float)dst.getHeight();

	tcu::Vec4									uq					= sq * (float)src.getWidth();

	tcu::Vec3									triS[2]				= { sq.swizzle(0, 1, 2), sq.swizzle(3, 2, 1) };
	tcu::Vec3									triU[2]				= { uq.swizzle(0, 1, 2), uq.swizzle(3, 2, 1) };
	tcu::Vec3									triW[2]				= { params.w.swizzle(0, 1, 2), params.w.swizzle(3, 2, 1) };

	for (int py = 0; py < dst.getHeight(); py++)
	{
		for (int px = 0; px < dst.getWidth(); px++)
		{
			float	wx		= (float)px + 0.5f;
			float	wy		= (float)py + 0.5f;
			float	nx		= wx / dstW;
			float	ny		= wy / dstH;

			int		triNdx	= nx + ny >= 1.0f ? 1 : 0;
			float	triWx	= triNdx ? dstW - wx : wx;
			float	triWy	= triNdx ? dstH - wy : wy;
			float	triNx	= triNdx ? 1.0f - nx : nx;
			float	triNy	= triNdx ? 1.0f - ny : ny;

			float	s		= projectedTriInterpolate(triS[triNdx], triW[triNdx], triNx, triNy);
			float	lod		= computeProjectedTriLod(params.lodMode, triU[triNdx], triW[triNdx], triWx, triWy, (float)dst.getWidth(), (float)dst.getHeight())
							+ lodBias;

			dst.setPixel(execSample(src, params, s, lod) * params.colorScale + params.colorBias, px, py);
		}
	}
}